

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O2

void doDecodeTile(exr_context_t f,pixels *p,int xs,int ys)

{
  bool bVar1;
  exr_coding_channel_info_t *peVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  ostream *poVar7;
  char *pcVar8;
  undefined4 in_register_0000000c;
  int32_t *func;
  exr_decode_pipeline_t *func_00;
  void **ptr_00;
  int iVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  int32_t tileh;
  int32_t tilew;
  int local_29c;
  int local_298;
  int local_294;
  int32_t linestride;
  int32_t pixelstride;
  int32_t tlevy;
  int32_t tlevx;
  exr_context_t local_280;
  ulong local_278;
  void *ptr;
  exr_chunk_info_t cinfo;
  exr_decode_pipeline_t decoder;
  
  if ((xs != 1) || (ys != 1)) {
    core_test_fail("xs == 1 && ys == 1",(char *)0x3de,0x1566ba,
                   (char *)CONCAT44(in_register_0000000c,ys));
  }
  func = &tlevy;
  iVar3 = exr_get_tile_levels(f,0,&tlevx);
  if (iVar3 != 0) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar3);
    poVar7 = std::operator<<(poVar7,") ");
    pcVar8 = (char *)exr_get_default_error_message(iVar3);
    poVar7 = std::operator<<(poVar7,pcVar8);
    std::endl<char,std::char_traits<char>>(poVar7);
    core_test_fail("exr_get_tile_levels (f, 0, &tlevx, &tlevy)",(char *)0x3df,0x1566ba,(char *)func)
    ;
  }
  if ((tlevx == 1) && (tlevy == 1)) {
    func_00 = (exr_decode_pipeline_t *)0x0;
    iVar3 = exr_get_tile_sizes(f,0,0,0,&tilew,&tileh);
    if (iVar3 != 0) {
      poVar7 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar3);
      poVar7 = std::operator<<(poVar7,") ");
      pcVar8 = (char *)exr_get_default_error_message(iVar3);
      poVar7 = std::operator<<(poVar7,pcVar8);
      std::endl<char,std::char_traits<char>>(poVar7);
      core_test_fail("exr_get_tile_sizes (f, 0, 0, 0, &tilew, &tileh)",(char *)0x3e2,0x1566ba,
                     (char *)func_00);
    }
    if ((tilew != 0x20) || (tileh != 0x20)) {
      core_test_fail("tilew == 32 && tileh == 32",(char *)0x3e3,0x1566ba,(char *)func_00);
    }
    uVar11 = 0;
    iVar3 = 0x1d;
    bVar1 = true;
    local_280 = f;
    do {
      if (0xbb < iVar3) {
        iVar3 = exr_decoding_destroy(f,&decoder);
        if (iVar3 == 0) {
          return;
        }
        poVar7 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar3);
        poVar7 = std::operator<<(poVar7,") ");
        pcVar8 = (char *)exr_get_default_error_message(iVar3);
        poVar7 = std::operator<<(poVar7,pcVar8);
        std::endl<char,std::char_traits<char>>(poVar7);
        core_test_fail("exr_decoding_destroy (f, &decoder)",(char *)0x41a,0x1566ba,(char *)func_00);
      }
      iVar5 = 0;
      iVar9 = 0x11;
      local_298 = iVar3;
      local_278 = uVar11;
      while( true ) {
        iVar4 = (int)local_278;
        if (0x56b < iVar9) break;
        pcVar8 = (char *)(local_278 & 0xffffffff);
        local_29c = iVar5;
        local_294 = iVar9;
        iVar3 = exr_read_tile_chunk_info(f,0,iVar5,pcVar8,0,0,&cinfo);
        if (iVar3 != 0) {
          poVar7 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar3);
          poVar7 = std::operator<<(poVar7,") ");
          pcVar6 = (char *)exr_get_default_error_message(iVar3);
          poVar7 = std::operator<<(poVar7,pcVar6);
          std::endl<char,std::char_traits<char>>(poVar7);
          core_test_fail("exr_read_tile_chunk_info (f, 0, tilex, tiley, 0, 0, &cinfo)",(char *)0x3f1
                         ,0x1566ba,pcVar8);
        }
        if (bVar1) {
          func_00 = &decoder;
          iVar3 = exr_decoding_initialize(f,0,&cinfo);
          if (iVar3 != 0) {
            poVar7 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar3);
            poVar7 = std::operator<<(poVar7,") ");
            pcVar8 = (char *)exr_get_default_error_message(iVar3);
            poVar7 = std::operator<<(poVar7,pcVar8);
            std::endl<char,std::char_traits<char>>(poVar7);
            core_test_fail("exr_decoding_initialize (f, 0, &cinfo, &decoder)",(char *)0x3f5,0x1566ba
                           ,(char *)func_00);
          }
        }
        else {
          func_00 = &decoder;
          iVar3 = exr_decoding_update(f,0,&cinfo);
          if (iVar3 != 0) {
            poVar7 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar3);
            poVar7 = std::operator<<(poVar7,") ");
            pcVar8 = (char *)exr_get_default_error_message(iVar3);
            poVar7 = std::operator<<(poVar7,pcVar8);
            std::endl<char,std::char_traits<char>>(poVar7);
            core_test_fail("exr_decoding_update (f, 0, &cinfo, &decoder)",(char *)0x3fa,0x1566ba,
                           (char *)func_00);
          }
        }
        iVar4 = tileh * iVar4;
        iVar3 = p->_stride_x;
        iVar9 = tilew * local_29c;
        lVar12 = 0;
        for (lVar10 = 0; peVar2 = decoder.channels, f = local_280, lVar10 < decoder.channel_count;
            lVar10 = lVar10 + 1) {
          ptr_00 = &ptr;
          fill_pointers(p,(exr_coding_channel_info_t *)
                          ((long)&(decoder.channels)->channel_name + lVar12),iVar9 + iVar4 * iVar3,
                        ptr_00,&pixelstride,&linestride);
          iVar5 = (int)*(short *)((long)&peVar2->user_bytes_per_element + lVar12);
          if (pixelstride != iVar5) {
            core_test_fail("curchan.user_bytes_per_element == pixelstride",(char *)0x40a,0x1566ba,
                           (char *)ptr_00);
          }
          *(void **)((long)&(decoder.channels)->field_12 + lVar12) = ptr;
          *(int *)((long)&(decoder.channels)->user_pixel_stride + lVar12) = iVar5;
          *(int32_t *)((long)&(decoder.channels)->user_line_stride + lVar12) = linestride;
          lVar12 = lVar12 + 0x30;
          func_00 = (exr_decode_pipeline_t *)decoder.channels;
        }
        if (bVar1) {
          iVar3 = exr_decoding_choose_default_routines(local_280,0,&decoder);
          if (iVar3 != 0) {
            poVar7 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar3);
            poVar7 = std::operator<<(poVar7,") ");
            pcVar8 = (char *)exr_get_default_error_message(iVar3);
            poVar7 = std::operator<<(poVar7,pcVar8);
            std::endl<char,std::char_traits<char>>(poVar7);
            core_test_fail("exr_decoding_choose_default_routines (f, 0, &decoder)",(char *)0x414,
                           0x1566ba,(char *)func_00);
          }
        }
        iVar3 = exr_decoding_run(f,0,&decoder);
        if (iVar3 != 0) {
          poVar7 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar3);
          poVar7 = std::operator<<(poVar7,") ");
          pcVar8 = (char *)exr_get_default_error_message(iVar3);
          poVar7 = std::operator<<(poVar7,pcVar8);
          std::endl<char,std::char_traits<char>>(poVar7);
          core_test_fail("exr_decoding_run (f, 0, &decoder)",(char *)0x416,0x1566ba,(char *)func_00)
          ;
        }
        iVar9 = local_294 + tilew;
        iVar5 = local_29c + 1;
        bVar1 = false;
      }
      iVar3 = local_298 + tileh;
      uVar11 = (ulong)(iVar4 + 1);
    } while( true );
  }
  core_test_fail("tlevx == 1 && tlevy == 1",(char *)0x3e0,0x1566ba,(char *)func);
}

Assistant:

static void
doDecodeTile (exr_context_t f, pixels& p, int xs, int ys)
{
    int32_t               tlevx, tlevy;
    int32_t               tilew, tileh;
    int32_t               tilex, tiley;
    int                   y, endy;
    int                   x, endx;
    exr_chunk_info_t      cinfo;
    exr_decode_pipeline_t decoder;
    bool                  first = true;

    EXRCORE_TEST (xs == 1 && ys == 1);
    EXRCORE_TEST_RVAL (exr_get_tile_levels (f, 0, &tlevx, &tlevy));
    EXRCORE_TEST (tlevx == 1 && tlevy == 1);

    EXRCORE_TEST_RVAL (exr_get_tile_sizes (f, 0, 0, 0, &tilew, &tileh));
    EXRCORE_TEST (tilew == 32 && tileh == 32);

    y     = IMG_DATA_Y * ys;
    endy  = y + IMG_HEIGHT * ys;
    tiley = 0;
    for (; y < endy; y += tileh, ++tiley)
    {
        tilex = 0;

        x    = IMG_DATA_X * xs;
        endx = x + IMG_WIDTH * xs;
        for (; x < endx; x += tilew, ++tilex)
        {
            EXRCORE_TEST_RVAL (
                exr_read_tile_chunk_info (f, 0, tilex, tiley, 0, 0, &cinfo));
            if (first)
            {
                EXRCORE_TEST_RVAL (
                    exr_decoding_initialize (f, 0, &cinfo, &decoder));
            }
            else
            {
                EXRCORE_TEST_RVAL (
                    exr_decoding_update (f, 0, &cinfo, &decoder));
            }

            int32_t idxoffset = tiley * tileh * p._stride_x + tilex * tilew;

            for (int c = 0; c < decoder.channel_count; ++c)
            {
                const exr_coding_channel_info_t& curchan = decoder.channels[c];
                void*                            ptr;
                int32_t                          pixelstride;
                int32_t                          linestride;

                fill_pointers (
                    p, curchan, idxoffset, &ptr, &pixelstride, &linestride);

                // make sure the setup has initialized our bytes for us
                EXRCORE_TEST (curchan.user_bytes_per_element == pixelstride);

                decoder.channels[c].decode_to_ptr     = (uint8_t*) ptr;
                decoder.channels[c].user_pixel_stride = pixelstride;
                decoder.channels[c].user_line_stride  = linestride;
            }

            if (first)
            {
                EXRCORE_TEST_RVAL (
                    exr_decoding_choose_default_routines (f, 0, &decoder));
            }
            EXRCORE_TEST_RVAL (exr_decoding_run (f, 0, &decoder));
            first = false;
        }
    }
    EXRCORE_TEST_RVAL (exr_decoding_destroy (f, &decoder));
}